

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rearrangeFunctions.cpp
# Opt level: O0

void __thiscall GraphSam::addConnection(GraphSam *this,int parent,int child)

{
  bool bVar1;
  int iVar2;
  __shared_ptr_access<GraphNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar3;
  weak_ptr<GraphNode> local_68;
  __shared_ptr_access<GraphNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_58;
  shared_ptr<GraphNode> *m;
  iterator __end3;
  iterator __begin3;
  vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_> *__range3;
  shared_ptr<GraphNode> *n;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_> *__range1;
  int child_local;
  int parent_local;
  GraphSam *this_local;
  
  __end1 = std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>::
           begin(&this->m_nodes);
  n = (shared_ptr<GraphNode> *)
      std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>::end
                (&this->m_nodes);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<GraphNode>_*,_std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>_>
                                *)&n);
    if (!bVar1) {
      return;
    }
    this_00 = (__shared_ptr_access<GraphNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<GraphNode>_*,_std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>_>
              ::operator*(&__end1);
    peVar3 = std::__shared_ptr_access<GraphNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    iVar2 = GraphNode::getValue(peVar3);
    if (iVar2 == parent) {
      peVar3 = std::__shared_ptr_access<GraphNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_00);
      bVar1 = GraphNode::hasPointer(peVar3,child);
      if (bVar1) {
        return;
      }
      __end3 = std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>
               ::begin(&this->m_nodes);
      m = (shared_ptr<GraphNode> *)
          std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>::end
                    (&this->m_nodes);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::shared_ptr<GraphNode>_*,_std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>_>
                                         *)&m), bVar1) {
        local_58 = (__shared_ptr_access<GraphNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   __gnu_cxx::
                   __normal_iterator<std::shared_ptr<GraphNode>_*,_std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>_>
                   ::operator*(&__end3);
        peVar3 = std::__shared_ptr_access<GraphNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(local_58);
        iVar2 = GraphNode::getValue(peVar3);
        if (iVar2 == child) {
          peVar3 = std::__shared_ptr_access<GraphNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(this_00);
          std::weak_ptr<GraphNode>::weak_ptr<GraphNode,void>
                    (&local_68,(shared_ptr<GraphNode> *)local_58);
          GraphNode::addPointer(peVar3,&local_68);
          std::weak_ptr<GraphNode>::~weak_ptr(&local_68);
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<GraphNode>_*,_std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>_>
        ::operator++(&__end3);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<GraphNode>_*,_std::vector<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void GraphSam::addConnection(int parent, int child) {

    // Search for parent node
    for (auto &n : m_nodes) {
        if (n->getValue() == parent) {

            // Avoid circular connections
            if (n->hasPointer(child))
                return;

            // Search for child node
            for (const auto &m : m_nodes) {
                if (m->getValue() == child)
                    n->addPointer(m);
            }

        }
    }

}